

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_distance.cpp
# Opt level: O1

void duckdb::ListGenericFold<double,duckdb::CosineSimilarityOp>
               (DataChunk *args,ExpressionState *state,Vector *result)

{
  ulong *puVar1;
  VectorType VVar2;
  VectorType VVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  SelectionVector *count;
  unsigned_long *puVar8;
  double *pdVar9;
  data_ptr_t pdVar10;
  list_entry_t *plVar11;
  data_ptr_t pdVar12;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var13;
  __uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_> _Var14;
  undefined4 uVar17;
  undefined4 uVar18;
  data_ptr_t pdVar15;
  undefined4 uVar19;
  undefined4 uVar20;
  pointer pcVar16;
  byte bVar21;
  double dVar22;
  anon_class_24_3_3d016869 fun;
  anon_class_24_3_3d016869 fun_00;
  anon_class_24_3_3d016869 fun_01;
  anon_class_24_3_3d016869 fun_02;
  anon_class_24_3_3d016869 fun_03;
  anon_class_24_3_3d016869 fun_04;
  anon_class_24_3_3d016869 fun_05;
  anon_class_24_3_3d016869 fun_06;
  anon_class_24_3_3d016869 fun_07;
  anon_class_24_3_3d016869 fun_08;
  anon_class_24_3_3d016869 fun_09;
  anon_class_24_3_3d016869 fun_10;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var23;
  undefined8 uVar24;
  undefined8 uVar25;
  data_ptr_t pdVar26;
  bool bVar27;
  BoundFunctionExpression *pBVar28;
  reference vec;
  reference vec_00;
  idx_t iVar29;
  idx_t count_00;
  Vector *this;
  Vector *this_00;
  idx_t iVar30;
  TemplatedValidityData<unsigned_long> *pTVar31;
  SelectionVector *pSVar32;
  _Head_base<0UL,_unsigned_long_*,_false> _Var33;
  undefined1 *puVar34;
  InvalidInputException *pIVar35;
  SelectionVector *pSVar36;
  ulong uVar37;
  unsigned_long uVar38;
  SelectionVector *pSVar39;
  idx_t idx_in_entry;
  ulong uVar40;
  string *psVar41;
  ValidityMask *pVVar42;
  uint64_t *puVar43;
  ValidityMask *other;
  long lVar44;
  ulong uVar45;
  list_entry_t left;
  list_entry_t left_00;
  list_entry_t left_01;
  list_entry_t left_02;
  list_entry_t left_03;
  list_entry_t left_04;
  list_entry_t left_05;
  list_entry_t lVar46;
  list_entry_t right;
  list_entry_t right_00;
  list_entry_t right_01;
  list_entry_t right_02;
  list_entry_t right_03;
  list_entry_t right_04;
  list_entry_t right_05;
  list_entry_t right_06;
  UnifiedVectorFormat ldata;
  double *rhs_data;
  double *lhs_data;
  uint64_t *local_188;
  SelectionVector *local_138;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_130;
  undefined1 local_128 [16];
  SelectionVector local_118 [2];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_e8;
  DataChunk *local_d8;
  idx_t local_d0;
  UnifiedVectorFormat local_c8;
  double *local_80;
  undefined1 local_78 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  pBVar28 = BaseExpression::Cast<duckdb::BoundFunctionExpression>
                      (&state->expr->super_BaseExpression);
  count = (SelectionVector *)args->count;
  vec = vector<duckdb::Vector,_true>::operator[](&args->data,0);
  local_d8 = args;
  vec_00 = vector<duckdb::Vector,_true>::operator[](&args->data,1);
  iVar29 = ListVector::GetListSize(vec);
  count_00 = ListVector::GetListSize(vec_00);
  this = ListVector::GetEntry(vec);
  this_00 = ListVector::GetEntry(vec_00);
  Vector::Flatten(this,iVar29);
  Vector::Flatten(this_00,count_00);
  FlatVector::VerifyFlatVector(this);
  iVar30 = TemplatedValidityMask<unsigned_long>::CountValid
                     (&(this->validity).super_TemplatedValidityMask<unsigned_long>,iVar29);
  if (iVar30 != iVar29) {
    pIVar35 = (InvalidInputException *)__cxa_allocate_exception(0x10);
    local_128._0_8_ = local_118;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_128,"%s: left argument can not contain NULL values","");
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    pcVar16 = (pBVar28->function).super_BaseScalarFunction.super_SimpleFunction.super_Function.name.
              _M_dataplus._M_p;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_50,pcVar16,
               pcVar16 + (pBVar28->function).super_BaseScalarFunction.super_SimpleFunction.
                         super_Function.name._M_string_length);
    InvalidInputException::InvalidInputException<std::__cxx11::string>
              (pIVar35,(string *)local_128,&local_50);
    __cxa_throw(pIVar35,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
  }
  FlatVector::VerifyFlatVector(this_00);
  iVar29 = TemplatedValidityMask<unsigned_long>::CountValid
                     (&(this_00->validity).super_TemplatedValidityMask<unsigned_long>,count_00);
  if (iVar29 != count_00) {
    pIVar35 = (InvalidInputException *)__cxa_allocate_exception(0x10);
    local_128._0_8_ = local_118;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_128,"%s: right argument can not contain NULL values","");
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    pcVar16 = (pBVar28->function).super_BaseScalarFunction.super_SimpleFunction.super_Function.name.
              _M_dataplus._M_p;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_70,pcVar16,
               pcVar16 + (pBVar28->function).super_BaseScalarFunction.super_SimpleFunction.
                         super_Function.name._M_string_length);
    InvalidInputException::InvalidInputException<std::__cxx11::string>
              (pIVar35,(string *)local_128,&local_70);
    __cxa_throw(pIVar35,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
  }
  psVar41 = &(pBVar28->function).super_BaseScalarFunction.super_SimpleFunction.super_Function.name;
  local_78 = (undefined1  [8])this->data;
  local_80 = (double *)this_00->data;
  VVar2 = vec->vector_type;
  VVar3 = vec_00->vector_type;
  if ((VVar2 ^ CONSTANT_VECTOR) == FLAT_VECTOR && (VVar3 ^ CONSTANT_VECTOR) == FLAT_VECTOR) {
    Vector::SetVectorType(result,CONSTANT_VECTOR);
    puVar8 = (vec->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
    pdVar9 = (double *)result->data;
    if (((puVar8 == (unsigned_long *)0x0) || ((*puVar8 & 1) != 0)) &&
       ((puVar8 = (vec_00->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask,
        puVar8 == (unsigned_long *)0x0 || ((*puVar8 & 1) != 0)))) {
      fun.lhs_data = (double **)local_78;
      fun.func_name = psVar41;
      fun.rhs_data = &local_80;
      dVar22 = BinaryLambdaWrapperWithNulls::
               Operation<duckdb::ListGenericFold<double,duckdb::CosineSimilarityOp>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::list_entry_t_const&,duckdb::list_entry_t_const&,duckdb::ValidityMask&,unsigned_long)_1_,bool,duckdb::list_entry_t,duckdb::list_entry_t,double>
                         (fun,*(list_entry_t *)vec->data,*(list_entry_t *)vec_00->data,
                          &result->validity,0);
      *pdVar9 = dVar22;
      goto LAB_00fced6e;
    }
  }
  else {
    if ((VVar3 ^ CONSTANT_VECTOR) == FLAT_VECTOR && VVar2 == FLAT_VECTOR) {
      pdVar10 = vec->data;
      plVar11 = (list_entry_t *)vec_00->data;
      puVar8 = (vec_00->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if ((puVar8 == (unsigned_long *)0x0) || ((*puVar8 & 1) != 0)) {
        Vector::SetVectorType(result,FLAT_VECTOR);
        pdVar12 = result->data;
        FlatVector::VerifyFlatVector(result);
        pVVar42 = &result->validity;
        FlatVector::VerifyFlatVector(vec);
        (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity = (idx_t)count;
        if ((vec->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) {
          p_Var13 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                    internal.
                    super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi;
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = (element_type *)0x0;
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          local_c8.sel = count;
          if (p_Var13 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var13);
          }
          _Var33._M_head_impl = (unsigned_long *)0x0;
        }
        else {
          local_c8.sel = count;
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long*const&,unsigned_long&>
                    ((duckdb *)local_128,(unsigned_long **)&vec->validity,(unsigned_long *)&local_c8
                    );
          uVar25 = local_128._8_8_;
          uVar24 = local_128._0_8_;
          local_128._0_8_ = (SelectionVector *)0x0;
          local_128._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          p_Var13 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                    internal.
                    super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi;
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = (element_type *)uVar24;
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar25;
          if (p_Var13 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var13);
          }
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_128._8_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_128._8_8_);
          }
          pTVar31 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                              (&(result->validity).super_TemplatedValidityMask<unsigned_long>.
                                validity_data);
          _Var33._M_head_impl =
               (pTVar31->owned_data).
               super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
               super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
               super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
               super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
        }
        (pVVar42->super_TemplatedValidityMask<unsigned_long>).validity_mask = _Var33._M_head_impl;
        if (_Var33._M_head_impl == (unsigned_long *)0x0) {
          if (count != (SelectionVector *)0x0) {
            lVar46 = *plVar11;
            local_188 = (uint64_t *)(pdVar10 + 8);
            pSVar39 = (SelectionVector *)0x0;
            do {
              fun_03.lhs_data = (double **)local_78;
              fun_03.func_name = psVar41;
              fun_03.rhs_data = &local_80;
              left_02.length = *local_188;
              left_02.offset = local_188[-1];
              dVar22 = BinaryLambdaWrapperWithNulls::
                       Operation<duckdb::ListGenericFold<double,duckdb::CosineSimilarityOp>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::list_entry_t_const&,duckdb::list_entry_t_const&,duckdb::ValidityMask&,unsigned_long)_1_,bool,duckdb::list_entry_t,duckdb::list_entry_t,double>
                                 (fun_03,left_02,lVar46,pVVar42,(idx_t)pSVar39);
              *(double *)(pdVar12 + (long)pSVar39 * 8) = dVar22;
              pSVar39 = (SelectionVector *)
                        ((long)&(((unsafe_unique_array<unsigned_long> *)&pSVar39->sel_vector)->
                                super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>
                                )._M_t.
                                super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>
                                ._M_t + 1);
              local_188 = local_188 + 2;
            } while (count != pSVar39);
          }
        }
        else {
          puVar34 = (undefined1 *)
                    ((long)&count[2].selection_data.internal.
                            super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr + 7);
          if ((undefined1 *)0x3f < puVar34) {
            uVar37 = 0;
            pSVar39 = (SelectionVector *)0x0;
            do {
              puVar8 = (pVVar42->super_TemplatedValidityMask<unsigned_long>).validity_mask;
              if (puVar8 == (unsigned_long *)0x0) {
                uVar38 = 0xffffffffffffffff;
              }
              else {
                uVar38 = puVar8[uVar37];
              }
              pSVar32 = (SelectionVector *)
                        &pSVar39[2].selection_data.internal.
                         super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount;
              if (count <= pSVar32) {
                pSVar32 = count;
              }
              pSVar36 = pSVar32;
              if (uVar38 != 0) {
                pSVar36 = pSVar39;
                if (uVar38 == 0xffffffffffffffff) {
                  if (pSVar39 < pSVar32) {
                    lVar46 = *plVar11;
                    puVar43 = (uint64_t *)(pdVar10 + (long)pSVar39 * 0x10 + 8);
                    do {
                      fun_01.lhs_data = (double **)local_78;
                      fun_01.func_name = psVar41;
                      fun_01.rhs_data = &local_80;
                      left_00.length = *puVar43;
                      left_00.offset = puVar43[-1];
                      dVar22 = BinaryLambdaWrapperWithNulls::
                               Operation<duckdb::ListGenericFold<double,duckdb::CosineSimilarityOp>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::list_entry_t_const&,duckdb::list_entry_t_const&,duckdb::ValidityMask&,unsigned_long)_1_,bool,duckdb::list_entry_t,duckdb::list_entry_t,double>
                                         (fun_01,left_00,lVar46,pVVar42,(idx_t)pSVar36);
                      *(double *)(pdVar12 + (long)pSVar36 * 8) = dVar22;
                      pSVar36 = (SelectionVector *)
                                ((long)&(((unsafe_unique_array<unsigned_long> *)&pSVar36->sel_vector
                                         )->
                                        super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>
                                        )._M_t.
                                        super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>
                                        ._M_t + 1);
                      puVar43 = puVar43 + 2;
                    } while (pSVar32 != pSVar36);
                  }
                }
                else if (pSVar39 < pSVar32) {
                  puVar43 = (uint64_t *)(pdVar10 + (long)pSVar39 * 0x10 + 8);
                  uVar40 = 0;
                  do {
                    if ((uVar38 >> (uVar40 & 0x3f) & 1) != 0) {
                      fun_02.lhs_data = (double **)local_78;
                      fun_02.func_name = psVar41;
                      fun_02.rhs_data = &local_80;
                      left_01.length = *puVar43;
                      left_01.offset = puVar43[-1];
                      dVar22 = BinaryLambdaWrapperWithNulls::
                               Operation<duckdb::ListGenericFold<double,duckdb::CosineSimilarityOp>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::list_entry_t_const&,duckdb::list_entry_t_const&,duckdb::ValidityMask&,unsigned_long)_1_,bool,duckdb::list_entry_t,duckdb::list_entry_t,double>
                                         (fun_02,left_01,*plVar11,pVVar42,
                                          (long)&(((unsafe_unique_array<unsigned_long> *)
                                                  &pSVar39->sel_vector)->
                                                 super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>
                                                 )._M_t.
                                                 super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>
                                                 ._M_t + uVar40);
                      *(double *)(pdVar12 + uVar40 * 8 + (long)pSVar39 * 8) = dVar22;
                    }
                    uVar40 = uVar40 + 1;
                    puVar43 = puVar43 + 2;
                  } while ((long)pSVar39 + (uVar40 - (long)pSVar32) != 0);
                  pSVar36 = (SelectionVector *)
                            ((long)&(((unsafe_unique_array<unsigned_long> *)&pSVar39->sel_vector)->
                                    super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>
                                    )._M_t.
                                    super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>
                                    ._M_t + uVar40);
                }
              }
              uVar37 = uVar37 + 1;
              pSVar39 = pSVar36;
            } while (uVar37 != (ulong)puVar34 >> 6);
          }
        }
        goto LAB_00fced6e;
      }
    }
    else {
      if ((VVar2 ^ CONSTANT_VECTOR) != FLAT_VECTOR || VVar3 != FLAT_VECTOR) {
        if (VVar3 == FLAT_VECTOR && VVar2 == FLAT_VECTOR) {
          pdVar10 = vec->data;
          pdVar12 = vec_00->data;
          local_128._0_8_ = psVar41;
          local_128._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78;
          local_118[0].sel_vector = (sel_t *)&local_80;
          Vector::SetVectorType(result,FLAT_VECTOR);
          pdVar15 = result->data;
          FlatVector::VerifyFlatVector(result);
          pVVar42 = &result->validity;
          FlatVector::VerifyFlatVector(vec);
          (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity = (idx_t)count;
          local_138 = count;
          if ((vec->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
              (unsigned_long *)0x0) {
            p_Var13 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                      internal.
                      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount._M_pi;
            (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
            super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr = (element_type *)0x0;
            (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
            super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            if (p_Var13 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var13);
            }
            _Var33._M_head_impl = (unsigned_long *)0x0;
          }
          else {
            make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long*const&,unsigned_long&>
                      ((duckdb *)&local_c8,(unsigned_long **)&vec->validity,
                       (unsigned_long *)&local_138);
            pdVar26 = local_c8.data;
            pSVar39 = local_c8.sel;
            local_c8.sel = (SelectionVector *)0x0;
            local_c8.data = (data_ptr_t)0x0;
            p_Var13 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                      internal.
                      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount._M_pi;
            (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
            super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr = (element_type *)pSVar39;
            (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
            super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pdVar26;
            if (p_Var13 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var13);
            }
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8.data !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8.data);
            }
            pTVar31 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                (&(result->validity).super_TemplatedValidityMask<unsigned_long>.
                                  validity_data);
            _Var33._M_head_impl =
                 (pTVar31->owned_data).
                 super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                 super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
                 super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                 super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
          }
          (pVVar42->super_TemplatedValidityMask<unsigned_long>).validity_mask = _Var33._M_head_impl;
          FlatVector::VerifyFlatVector(vec_00);
          other = &vec_00->validity;
          if (_Var33._M_head_impl == (unsigned_long *)0x0) {
            (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity = (idx_t)count;
            if ((other->super_TemplatedValidityMask<unsigned_long>).validity_mask ==
                (unsigned_long *)0x0) {
              p_Var13 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                        internal.
                        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount._M_pi;
              (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr = (element_type *)0x0;
              (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              local_138 = count;
              if (p_Var13 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var13);
              }
              _Var33._M_head_impl = (unsigned_long *)0x0;
            }
            else {
              local_138 = count;
              make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long*const&,unsigned_long&>
                        ((duckdb *)&local_c8,(unsigned_long **)other,(unsigned_long *)&local_138);
              pdVar26 = local_c8.data;
              pSVar39 = local_c8.sel;
              local_c8.sel = (SelectionVector *)0x0;
              local_c8.data = (data_ptr_t)0x0;
              p_Var13 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                        internal.
                        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount._M_pi;
              (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr = (element_type *)pSVar39;
              (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pdVar26;
              if (p_Var13 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var13);
              }
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8.data !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8.data);
              }
              pTVar31 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                  (&(result->validity).super_TemplatedValidityMask<unsigned_long>.
                                    validity_data);
              _Var33._M_head_impl =
                   (pTVar31->owned_data).
                   super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                   super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
                   super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                   super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
            }
            (pVVar42->super_TemplatedValidityMask<unsigned_long>).validity_mask =
                 _Var33._M_head_impl;
          }
          else {
            ValidityMask::Combine(pVVar42,other,(idx_t)count);
          }
          if ((pVVar42->super_TemplatedValidityMask<unsigned_long>).validity_mask ==
              (unsigned_long *)0x0) {
            if (count != (SelectionVector *)0x0) {
              lVar44 = 1;
              pSVar39 = (SelectionVector *)0x0;
              do {
                fun_10.lhs_data = (double **)local_128._8_8_;
                fun_10.func_name = (string *)local_128._0_8_;
                fun_10.rhs_data = (double **)local_118[0].sel_vector;
                lVar46.length = *(uint64_t *)(pdVar10 + lVar44 * 8);
                lVar46.offset = *(uint64_t *)(pdVar10 + lVar44 * 8 + -8);
                right_06.length = *(uint64_t *)(pdVar12 + lVar44 * 8);
                right_06.offset = *(uint64_t *)(pdVar12 + lVar44 * 8 + -8);
                dVar22 = BinaryLambdaWrapperWithNulls::
                         Operation<duckdb::ListGenericFold<double,duckdb::CosineSimilarityOp>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::list_entry_t_const&,duckdb::list_entry_t_const&,duckdb::ValidityMask&,unsigned_long)_1_,bool,duckdb::list_entry_t,duckdb::list_entry_t,double>
                                   (fun_10,lVar46,right_06,pVVar42,(idx_t)pSVar39);
                *(double *)(pdVar15 + (long)pSVar39 * 8) = dVar22;
                pSVar39 = (SelectionVector *)
                          ((long)&(((unsafe_unique_array<unsigned_long> *)&pSVar39->sel_vector)->
                                  super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>
                                  )._M_t.
                                  super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>
                                  ._M_t + 1);
                lVar44 = lVar44 + 2;
              } while (count != pSVar39);
            }
          }
          else {
            puVar34 = (undefined1 *)
                      ((long)&count[2].selection_data.internal.
                              super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr + 7);
            if ((undefined1 *)0x3f < puVar34) {
              uVar37 = 0;
              pSVar39 = (SelectionVector *)0x0;
              do {
                puVar8 = (pVVar42->super_TemplatedValidityMask<unsigned_long>).validity_mask;
                if (puVar8 == (unsigned_long *)0x0) {
                  uVar38 = 0xffffffffffffffff;
                }
                else {
                  uVar38 = puVar8[uVar37];
                }
                pSVar32 = (SelectionVector *)
                          &pSVar39[2].selection_data.internal.
                           super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount;
                if (count <= pSVar32) {
                  pSVar32 = count;
                }
                pSVar36 = pSVar32;
                if (uVar38 != 0) {
                  pSVar36 = pSVar39;
                  if (uVar38 == 0xffffffffffffffff) {
                    if (pSVar39 < pSVar32) {
                      uVar40 = (long)pSVar39 << 4 | 8;
                      do {
                        fun_08.lhs_data = (double **)local_128._8_8_;
                        fun_08.func_name = (string *)local_128._0_8_;
                        fun_08.rhs_data = (double **)local_118[0].sel_vector;
                        left_04.length = *(uint64_t *)(pdVar10 + uVar40);
                        left_04.offset = *(uint64_t *)(pdVar10 + (uVar40 - 8));
                        right_04.length = *(uint64_t *)(pdVar12 + uVar40);
                        right_04.offset = *(uint64_t *)(pdVar12 + (uVar40 - 8));
                        dVar22 = BinaryLambdaWrapperWithNulls::
                                 Operation<duckdb::ListGenericFold<double,duckdb::CosineSimilarityOp>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::list_entry_t_const&,duckdb::list_entry_t_const&,duckdb::ValidityMask&,unsigned_long)_1_,bool,duckdb::list_entry_t,duckdb::list_entry_t,double>
                                           (fun_08,left_04,right_04,pVVar42,(idx_t)pSVar39);
                        *(double *)(pdVar15 + (long)pSVar39 * 8) = dVar22;
                        pSVar39 = (SelectionVector *)
                                  ((long)&(((unsafe_unique_array<unsigned_long> *)
                                           &pSVar39->sel_vector)->
                                          super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>
                                          )._M_t.
                                          super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>
                                          ._M_t + 1);
                        uVar40 = uVar40 + 0x10;
                        pSVar36 = pSVar39;
                      } while (pSVar32 != pSVar39);
                    }
                  }
                  else if (pSVar39 < pSVar32) {
                    uVar40 = (long)pSVar39 << 4 | 8;
                    uVar45 = 0;
                    do {
                      if ((uVar38 >> (uVar45 & 0x3f) & 1) != 0) {
                        fun_09.lhs_data = (double **)local_128._8_8_;
                        fun_09.func_name = (string *)local_128._0_8_;
                        fun_09.rhs_data = (double **)local_118[0].sel_vector;
                        left_05.length = *(uint64_t *)(pdVar10 + uVar40);
                        left_05.offset = *(uint64_t *)(pdVar10 + (uVar40 - 8));
                        right_05.length = *(uint64_t *)(pdVar12 + uVar40);
                        right_05.offset = *(uint64_t *)(pdVar12 + (uVar40 - 8));
                        dVar22 = BinaryLambdaWrapperWithNulls::
                                 Operation<duckdb::ListGenericFold<double,duckdb::CosineSimilarityOp>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::list_entry_t_const&,duckdb::list_entry_t_const&,duckdb::ValidityMask&,unsigned_long)_1_,bool,duckdb::list_entry_t,duckdb::list_entry_t,double>
                                           (fun_09,left_05,right_05,pVVar42,
                                            (long)&(((unsafe_unique_array<unsigned_long> *)
                                                    &pSVar39->sel_vector)->
                                                                                                      
                                                  super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>
                                                  )._M_t.
                                                  super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>
                                                  ._M_t + uVar45);
                        *(double *)(pdVar15 + uVar45 * 8 + (long)pSVar39 * 8) = dVar22;
                      }
                      uVar45 = uVar45 + 1;
                      uVar40 = uVar40 + 0x10;
                    } while ((long)pSVar39 + (uVar45 - (long)pSVar32) != 0);
                    pSVar36 = (SelectionVector *)
                              ((long)&(((unsafe_unique_array<unsigned_long> *)&pSVar39->sel_vector)
                                      ->
                                      super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>
                                      )._M_t.
                                      super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>
                                      ._M_t + uVar45);
                  }
                }
                uVar37 = uVar37 + 1;
                pSVar39 = pSVar36;
              } while (uVar37 != (ulong)puVar34 >> 6);
            }
          }
        }
        else {
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_128);
          UnifiedVectorFormat::UnifiedVectorFormat(&local_c8);
          Vector::ToUnifiedFormat(vec,(idx_t)count,(UnifiedVectorFormat *)local_128);
          Vector::ToUnifiedFormat(vec_00,(idx_t)count,&local_c8);
          Vector::SetVectorType(result,FLAT_VECTOR);
          pdVar12 = local_c8.data;
          pSVar39 = local_c8.sel;
          uVar25 = local_128._8_8_;
          uVar24 = local_128._0_8_;
          pdVar10 = result->data;
          FlatVector::VerifyFlatVector(result);
          pVVar42 = &result->validity;
          if (local_c8.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
              (unsigned_long *)0x0 && (double **)local_118[0].sel_vector == (double **)0x0) {
            if (count != (SelectionVector *)0x0) {
              lVar44 = *(long *)uVar24;
              _Var14._M_t.
              super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
              super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
                   (((unsafe_unique_array<unsigned_long> *)&pSVar39->sel_vector)->
                   super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>)._M_t.
                   super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t;
              pSVar39 = (SelectionVector *)0x0;
              do {
                pSVar32 = pSVar39;
                if (lVar44 != 0) {
                  pSVar32 = (SelectionVector *)(ulong)*(uint *)(lVar44 + (long)pSVar39 * 4);
                }
                pSVar36 = pSVar39;
                if ((_Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>)
                    _Var14._M_t.
                    super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                    super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl !=
                    (unsigned_long *)0x0) {
                  pSVar36 = (SelectionVector *)
                            (ulong)*(uint *)((long)_Var14._M_t.
                                                                                                      
                                                  super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                                                  .super__Head_base<0UL,_unsigned_long_*,_false>.
                                                  _M_head_impl + (long)pSVar39 * 4);
                }
                uVar4 = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(uVar25 + pSVar32 * 0x10))
                        ->_M_use_count;
                uVar17 = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(uVar25 + pSVar32 * 0x10))
                         ->_M_weak_count;
                left.length._4_4_ = uVar17;
                left.length._0_4_ = uVar4;
                uVar5 = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                        ((long)pdVar12 + pSVar36 * 0x10))->_M_use_count;
                uVar18 = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                         ((long)pdVar12 + pSVar36 * 0x10))->_M_weak_count;
                right.length._4_4_ = uVar18;
                right.length._0_4_ = uVar5;
                fun_00.lhs_data = (double **)local_78;
                fun_00.func_name = psVar41;
                fun_00.rhs_data = &local_80;
                left.offset = (uint64_t)
                              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                              (uVar25 + pSVar32 * 0x10))->_vptr__Sp_counted_base;
                right.offset = (uint64_t)
                               ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                               ((long)pdVar12 + pSVar36 * 0x10))->_vptr__Sp_counted_base;
                dVar22 = BinaryLambdaWrapperWithNulls::
                         Operation<duckdb::ListGenericFold<double,duckdb::CosineSimilarityOp>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::list_entry_t_const&,duckdb::list_entry_t_const&,duckdb::ValidityMask&,unsigned_long)_1_,bool,duckdb::list_entry_t,duckdb::list_entry_t,double>
                                   (fun_00,left,right,pVVar42,(idx_t)pSVar39);
                *(double *)(pdVar10 + (long)pSVar39 * 8) = dVar22;
                pSVar39 = (SelectionVector *)
                          ((long)&(((unsafe_unique_array<unsigned_long> *)&pSVar39->sel_vector)->
                                  super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>
                                  )._M_t.
                                  super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>
                                  ._M_t + 1);
              } while (count != pSVar39);
            }
          }
          else if (count != (SelectionVector *)0x0) {
            lVar44 = *(long *)uVar24;
            _Var14._M_t.
            super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
            super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
                 (((unsafe_unique_array<unsigned_long> *)&pSVar39->sel_vector)->
                 super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>)._M_t.
                 super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t;
            pSVar39 = (SelectionVector *)0x0;
            do {
              pSVar32 = pSVar39;
              if (lVar44 != 0) {
                pSVar32 = (SelectionVector *)(ulong)*(uint *)(lVar44 + (long)pSVar39 * 4);
              }
              pSVar36 = pSVar39;
              if ((_Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>)
                  _Var14._M_t.
                  super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                  super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl != (unsigned_long *)0x0
                 ) {
                pSVar36 = (SelectionVector *)
                          (ulong)*(uint *)((long)_Var14._M_t.
                                                 super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                                                 .super__Head_base<0UL,_unsigned_long_*,_false>.
                                                 _M_head_impl + (long)pSVar39 * 4);
              }
              if ((((double **)local_118[0].sel_vector == (double **)0x0) ||
                  (((ulong)*(double **)((long)local_118[0].sel_vector + ((ulong)pSVar32 >> 6) * 8)
                    >> ((ulong)pSVar32 & 0x3f) & 1) != 0)) &&
                 ((local_c8.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
                   (unsigned_long *)0x0 ||
                  ((local_c8.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                    [(ulong)pSVar36 >> 6] >> ((ulong)pSVar36 & 0x3f) & 1) != 0)))) {
                uVar6 = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(uVar25 + pSVar32 * 0x10))
                        ->_M_use_count;
                uVar19 = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(uVar25 + pSVar32 * 0x10))
                         ->_M_weak_count;
                left_03.length._4_4_ = uVar19;
                left_03.length._0_4_ = uVar6;
                uVar7 = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                        ((long)pdVar12 + pSVar36 * 0x10))->_M_use_count;
                uVar20 = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                         ((long)pdVar12 + pSVar36 * 0x10))->_M_weak_count;
                right_00.length._4_4_ = uVar20;
                right_00.length._0_4_ = uVar7;
                fun_04.lhs_data = (double **)local_78;
                fun_04.func_name = psVar41;
                fun_04.rhs_data = &local_80;
                left_03.offset =
                     (uint64_t)
                     ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(uVar25 + pSVar32 * 0x10))->
                     _vptr__Sp_counted_base;
                right_00.offset =
                     (uint64_t)
                     ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     ((long)pdVar12 + pSVar36 * 0x10))->_vptr__Sp_counted_base;
                dVar22 = BinaryLambdaWrapperWithNulls::
                         Operation<duckdb::ListGenericFold<double,duckdb::CosineSimilarityOp>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::list_entry_t_const&,duckdb::list_entry_t_const&,duckdb::ValidityMask&,unsigned_long)_1_,bool,duckdb::list_entry_t,duckdb::list_entry_t,double>
                                   (fun_04,left_03,right_00,pVVar42,(idx_t)pSVar39);
                *(double *)(pdVar10 + (long)pSVar39 * 8) = dVar22;
              }
              else {
                if ((pVVar42->super_TemplatedValidityMask<unsigned_long>).validity_mask ==
                    (unsigned_long *)0x0) {
                  local_d0 = (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
                  make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                            ((duckdb *)&local_138,&local_d0);
                  p_Var23 = p_Stack_130;
                  pSVar32 = local_138;
                  local_138 = (SelectionVector *)0x0;
                  p_Stack_130 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                  p_Var13 = (result->validity).super_TemplatedValidityMask<unsigned_long>.
                            validity_data.internal.
                            super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                            ._M_refcount._M_pi;
                  (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                  internal.
                  super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr = (element_type *)pSVar32;
                  (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                  internal.
                  super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount._M_pi = p_Var23;
                  if (p_Var13 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var13);
                  }
                  if (p_Stack_130 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_130);
                  }
                  pTVar31 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::
                            operator->(&(result->validity).
                                        super_TemplatedValidityMask<unsigned_long>.validity_data);
                  (pVVar42->super_TemplatedValidityMask<unsigned_long>).validity_mask =
                       (unsigned_long *)
                       (pTVar31->owned_data).
                       super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t
                       .super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>.
                       _M_t.
                       super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                       .super__Head_base<0UL,_unsigned_long_*,_false>;
                }
                bVar21 = (byte)pSVar39 & 0x3f;
                puVar1 = (pVVar42->super_TemplatedValidityMask<unsigned_long>).validity_mask +
                         ((ulong)pSVar39 >> 6);
                *puVar1 = *puVar1 & (-2L << bVar21 | 0xfffffffffffffffeU >> 0x40 - bVar21);
              }
              pSVar39 = (SelectionVector *)
                        ((long)&(((unsafe_unique_array<unsigned_long> *)&pSVar39->sel_vector)->
                                super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>
                                )._M_t.
                                super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>
                                ._M_t + 1);
            } while (count != pSVar39);
          }
          if (local_c8.owned_sel.selection_data.internal.
              super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_c8.owned_sel.selection_data.internal.
                       super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
          if (local_c8.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_c8.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.
                       internal.
                       super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi);
          }
          if (local_e8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_e8._M_pi);
          }
          if (local_118[0].selection_data.internal.
              super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_118[0].selection_data.internal.
                       super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
        }
        goto LAB_00fced6e;
      }
      plVar11 = (list_entry_t *)vec->data;
      puVar8 = (vec->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      pdVar10 = vec_00->data;
      if ((puVar8 == (unsigned_long *)0x0) || ((*puVar8 & 1) != 0)) {
        Vector::SetVectorType(result,FLAT_VECTOR);
        pdVar12 = result->data;
        FlatVector::VerifyFlatVector(result);
        pVVar42 = &result->validity;
        FlatVector::VerifyFlatVector(vec_00);
        (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity = (idx_t)count;
        if ((vec_00->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) {
          p_Var13 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                    internal.
                    super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi;
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = (element_type *)0x0;
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          local_c8.sel = count;
          if (p_Var13 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var13);
          }
          _Var33._M_head_impl = (unsigned_long *)0x0;
        }
        else {
          local_c8.sel = count;
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long*const&,unsigned_long&>
                    ((duckdb *)local_128,(unsigned_long **)&vec_00->validity,
                     (unsigned_long *)&local_c8);
          uVar25 = local_128._8_8_;
          uVar24 = local_128._0_8_;
          local_128._0_8_ = (SelectionVector *)0x0;
          local_128._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          p_Var13 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                    internal.
                    super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi;
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = (element_type *)uVar24;
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar25;
          if (p_Var13 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var13);
          }
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_128._8_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_128._8_8_);
          }
          pTVar31 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                              (&(result->validity).super_TemplatedValidityMask<unsigned_long>.
                                validity_data);
          _Var33._M_head_impl =
               (pTVar31->owned_data).
               super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
               super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
               super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
               super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
        }
        (pVVar42->super_TemplatedValidityMask<unsigned_long>).validity_mask = _Var33._M_head_impl;
        if (_Var33._M_head_impl == (unsigned_long *)0x0) {
          if (count != (SelectionVector *)0x0) {
            lVar46 = *plVar11;
            local_188 = (uint64_t *)(pdVar10 + 8);
            pSVar39 = (SelectionVector *)0x0;
            do {
              fun_07.lhs_data = (double **)local_78;
              fun_07.func_name = psVar41;
              fun_07.rhs_data = &local_80;
              right_03.length = *local_188;
              right_03.offset = local_188[-1];
              dVar22 = BinaryLambdaWrapperWithNulls::
                       Operation<duckdb::ListGenericFold<double,duckdb::CosineSimilarityOp>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::list_entry_t_const&,duckdb::list_entry_t_const&,duckdb::ValidityMask&,unsigned_long)_1_,bool,duckdb::list_entry_t,duckdb::list_entry_t,double>
                                 (fun_07,lVar46,right_03,pVVar42,(idx_t)pSVar39);
              *(double *)(pdVar12 + (long)pSVar39 * 8) = dVar22;
              pSVar39 = (SelectionVector *)
                        ((long)&(((unsafe_unique_array<unsigned_long> *)&pSVar39->sel_vector)->
                                super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>
                                )._M_t.
                                super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>
                                ._M_t + 1);
              local_188 = local_188 + 2;
            } while (count != pSVar39);
          }
        }
        else {
          puVar34 = (undefined1 *)
                    ((long)&count[2].selection_data.internal.
                            super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr + 7);
          if ((undefined1 *)0x3f < puVar34) {
            uVar37 = 0;
            pSVar39 = (SelectionVector *)0x0;
            do {
              puVar8 = (pVVar42->super_TemplatedValidityMask<unsigned_long>).validity_mask;
              if (puVar8 == (unsigned_long *)0x0) {
                uVar38 = 0xffffffffffffffff;
              }
              else {
                uVar38 = puVar8[uVar37];
              }
              pSVar32 = (SelectionVector *)
                        &pSVar39[2].selection_data.internal.
                         super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount;
              if (count <= pSVar32) {
                pSVar32 = count;
              }
              pSVar36 = pSVar32;
              if (uVar38 != 0) {
                pSVar36 = pSVar39;
                if (uVar38 == 0xffffffffffffffff) {
                  if (pSVar39 < pSVar32) {
                    lVar46 = *plVar11;
                    puVar43 = (uint64_t *)(pdVar10 + (long)pSVar39 * 0x10 + 8);
                    do {
                      fun_05.lhs_data = (double **)local_78;
                      fun_05.func_name = psVar41;
                      fun_05.rhs_data = &local_80;
                      right_01.length = *puVar43;
                      right_01.offset = puVar43[-1];
                      dVar22 = BinaryLambdaWrapperWithNulls::
                               Operation<duckdb::ListGenericFold<double,duckdb::CosineSimilarityOp>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::list_entry_t_const&,duckdb::list_entry_t_const&,duckdb::ValidityMask&,unsigned_long)_1_,bool,duckdb::list_entry_t,duckdb::list_entry_t,double>
                                         (fun_05,lVar46,right_01,pVVar42,(idx_t)pSVar36);
                      *(double *)(pdVar12 + (long)pSVar36 * 8) = dVar22;
                      pSVar36 = (SelectionVector *)
                                ((long)&(((unsafe_unique_array<unsigned_long> *)&pSVar36->sel_vector
                                         )->
                                        super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>
                                        )._M_t.
                                        super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>
                                        ._M_t + 1);
                      puVar43 = puVar43 + 2;
                    } while (pSVar32 != pSVar36);
                  }
                }
                else if (pSVar39 < pSVar32) {
                  puVar43 = (uint64_t *)(pdVar10 + (long)pSVar39 * 0x10 + 8);
                  uVar40 = 0;
                  do {
                    if ((uVar38 >> (uVar40 & 0x3f) & 1) != 0) {
                      fun_06.lhs_data = (double **)local_78;
                      fun_06.func_name = psVar41;
                      fun_06.rhs_data = &local_80;
                      right_02.length = *puVar43;
                      right_02.offset = puVar43[-1];
                      dVar22 = BinaryLambdaWrapperWithNulls::
                               Operation<duckdb::ListGenericFold<double,duckdb::CosineSimilarityOp>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::list_entry_t_const&,duckdb::list_entry_t_const&,duckdb::ValidityMask&,unsigned_long)_1_,bool,duckdb::list_entry_t,duckdb::list_entry_t,double>
                                         (fun_06,*plVar11,right_02,pVVar42,
                                          (long)&(((unsafe_unique_array<unsigned_long> *)
                                                  &pSVar39->sel_vector)->
                                                 super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>
                                                 )._M_t.
                                                 super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>
                                                 ._M_t + uVar40);
                      *(double *)(pdVar12 + uVar40 * 8 + (long)pSVar39 * 8) = dVar22;
                    }
                    uVar40 = uVar40 + 1;
                    puVar43 = puVar43 + 2;
                  } while ((long)pSVar39 + (uVar40 - (long)pSVar32) != 0);
                  pSVar36 = (SelectionVector *)
                            ((long)&(((unsafe_unique_array<unsigned_long> *)&pSVar39->sel_vector)->
                                    super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>
                                    )._M_t.
                                    super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>
                                    ._M_t + uVar40);
                }
              }
              uVar37 = uVar37 + 1;
              pSVar39 = pSVar36;
            } while (uVar37 != (ulong)puVar34 >> 6);
          }
        }
        goto LAB_00fced6e;
      }
    }
    Vector::SetVectorType(result,CONSTANT_VECTOR);
  }
  ConstantVector::SetNull(result,true);
LAB_00fced6e:
  bVar27 = DataChunk::AllConstant(local_d8);
  if (bVar27) {
    Vector::SetVectorType(result,CONSTANT_VECTOR);
  }
  return;
}

Assistant:

static void ListGenericFold(DataChunk &args, ExpressionState &state, Vector &result) {
	const auto &lstate = state.Cast<ExecuteFunctionState>();
	const auto &expr = lstate.expr.Cast<BoundFunctionExpression>();
	const auto &func_name = expr.function.name;

	auto count = args.size();

	auto &lhs_vec = args.data[0];
	auto &rhs_vec = args.data[1];

	const auto lhs_count = ListVector::GetListSize(lhs_vec);
	const auto rhs_count = ListVector::GetListSize(rhs_vec);

	auto &lhs_child = ListVector::GetEntry(lhs_vec);
	auto &rhs_child = ListVector::GetEntry(rhs_vec);

	lhs_child.Flatten(lhs_count);
	rhs_child.Flatten(rhs_count);

	D_ASSERT(lhs_child.GetVectorType() == VectorType::FLAT_VECTOR);
	D_ASSERT(rhs_child.GetVectorType() == VectorType::FLAT_VECTOR);

	if (!FlatVector::Validity(lhs_child).CheckAllValid(lhs_count)) {
		throw InvalidInputException("%s: left argument can not contain NULL values", func_name);
	}

	if (!FlatVector::Validity(rhs_child).CheckAllValid(rhs_count)) {
		throw InvalidInputException("%s: right argument can not contain NULL values", func_name);
	}

	auto lhs_data = FlatVector::GetData<TYPE>(lhs_child);
	auto rhs_data = FlatVector::GetData<TYPE>(rhs_child);

	BinaryExecutor::ExecuteWithNulls<list_entry_t, list_entry_t, TYPE>(
	    lhs_vec, rhs_vec, result, count,
	    [&](const list_entry_t &left, const list_entry_t &right, ValidityMask &mask, idx_t row_idx) {
		    if (left.length != right.length) {
			    throw InvalidInputException(
			        "%s: list dimensions must be equal, got left length '%d' and right length '%d'", func_name,
			        left.length, right.length);
		    }

		    if (!OP::ALLOW_EMPTY && left.length == 0) {
			    mask.SetInvalid(row_idx);
			    return TYPE();
		    }

		    return OP::Operation(lhs_data + left.offset, rhs_data + right.offset, left.length);
	    });

	if (args.AllConstant()) {
		result.SetVectorType(VectorType::CONSTANT_VECTOR);
	}
}